

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O2

void aom_compute_flow_at_point_c
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int j_1;
  int i;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint8_t *puVar10;
  int iVar11;
  int16_t *piVar12;
  int16_t *piVar13;
  undefined1 *puVar14;
  int j_2;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int v_kernel [4];
  int h_kernel [4];
  int16_t dy [64];
  int16_t dx [64];
  undefined1 local_198 [96];
  undefined1 local_138 [264];
  
  iVar1 = stride * y + x;
  piVar12 = dx;
  iVar2 = width;
  sobel_filter(src + iVar1,stride,piVar12,1,width);
  piVar13 = dy;
  sobel_filter(src + iVar1,stride,piVar13,0,iVar2);
  iVar2 = 0;
  iVar3 = 0;
  iVar4 = 0;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
      iVar9 = (int)piVar12[lVar8];
      iVar2 = iVar2 + iVar9 * iVar9;
      iVar11 = (int)piVar13[lVar8];
      iVar3 = iVar3 + iVar9 * iVar11;
      iVar4 = iVar4 + iVar11 * iVar11;
    }
    piVar12 = piVar12 + 8;
    piVar13 = piVar13 + 8;
  }
  dVar18 = (double)iVar3;
  dVar19 = 1.0 / ((double)(iVar2 + 1) * (double)(iVar4 + 1) - dVar18 * dVar18);
  iVar3 = 0;
  do {
    if (iVar3 == 4) {
      return;
    }
    dVar21 = *u;
    dVar20 = *v;
    dVar16 = floor(dVar21);
    dVar17 = floor(dVar20);
    get_cubic_kernel_int(dVar21 - dVar16,h_kernel);
    get_cubic_kernel_int(dVar20 - dVar17,v_kernel);
    iVar11 = (int)dVar16 + x;
    iVar9 = width;
    if (iVar11 < width) {
      iVar9 = iVar11;
    }
    if (iVar11 < -9) {
      iVar9 = -9;
    }
    iVar5 = (int)dVar17 + y;
    iVar11 = height;
    if (iVar5 < height) {
      iVar11 = iVar5;
    }
    if (iVar5 < -9) {
      iVar11 = -9;
    }
    puVar10 = ref + (long)iVar9 + ((long)iVar11 + -1) * (long)stride;
    iVar5 = (iVar11 + -1) * stride;
    iVar11 = iVar9 + iVar5;
    iVar9 = iVar9 + iVar5 + -1;
    puVar14 = local_198;
    for (lVar7 = -1; lVar7 != 10; lVar7 = lVar7 + 1) {
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        iVar5 = (int)lVar8;
        *(int *)(puVar14 + lVar8 * 4) =
             (int)((uint)ref[iVar11 + iVar5 + 2] * h_kernel[3] +
                   (uint)ref[iVar11 + iVar5 + 1] * h_kernel[2] +
                   (uint)puVar10[lVar8] * h_kernel[1] + (uint)ref[iVar9 + iVar5] * h_kernel[0] +
                  0x80) >> 8;
      }
      puVar14 = puVar14 + 0x20;
      puVar10 = puVar10 + stride;
      iVar11 = iVar11 + stride;
      iVar9 = iVar9 + stride;
    }
    iVar9 = 0;
    piVar12 = dy;
    piVar13 = dx;
    puVar14 = local_138;
    iVar11 = 0;
    iVar6 = 0;
    iVar15 = 0;
    iVar5 = iVar1;
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        iVar9 = (*(int *)(puVar14 + lVar8 * 4) * v_kernel[3] +
                 *(int *)(puVar14 + lVar8 * 4 + -0x20) * v_kernel[2] +
                 *(int *)(puVar14 + lVar8 * 4 + -0x40) * v_kernel[1] +
                 *(int *)(puVar14 + lVar8 * 4 + -0x60) * v_kernel[0] + 0x10000 >> 0x11) +
                (uint)src[iVar5 + (int)lVar8] * -8;
        iVar15 = piVar13[lVar8] * iVar9 + iVar15;
        iVar6 = piVar12[lVar8] * iVar9 + iVar6;
        iVar9 = iVar6;
        iVar11 = iVar15;
      }
      puVar14 = puVar14 + 0x20;
      piVar13 = piVar13 + 8;
      piVar12 = piVar12 + 8;
      iVar5 = iVar5 + stride;
    }
    dVar16 = (double)iVar11 * (double)(iVar4 + 1) * dVar19 + (double)iVar9 * -dVar18 * dVar19;
    dVar17 = (double)iVar11 * -dVar18 * dVar19 + (double)iVar9 * dVar19 * (double)(iVar2 + 1);
    dVar20 = 2.0;
    if (dVar16 <= 2.0) {
      dVar20 = dVar16;
    }
    *u = dVar21 + (double)(-(ulong)(dVar16 < -2.0) & 0xc000000000000000 |
                          ~-(ulong)(dVar16 < -2.0) & (ulong)dVar20);
    dVar21 = 2.0;
    if (dVar17 <= 2.0) {
      dVar21 = dVar17;
    }
    *v = (double)(-(ulong)(dVar17 < -2.0) & 0xc000000000000000 |
                 ~-(ulong)(dVar17 < -2.0) & (ulong)dVar21) + *v;
    iVar3 = iVar3 + 1;
  } while (0.125 <= ABS(dVar17) + ABS(dVar16));
  return;
}

Assistant:

void aom_compute_flow_at_point_c(const uint8_t *src, const uint8_t *ref, int x,
                                 int y, int width, int height, int stride,
                                 double *u, double *v) {
  double M[4];
  double M_inv[4];
  int b[2];
  int16_t dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE];
  int16_t dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, DISFLOW_PATCH_SIZE, 1);
  sobel_filter(src_patch, stride, dy, DISFLOW_PATCH_SIZE, 0);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}